

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_matcher.hpp
# Opt level: O2

void __thiscall PathMatcher<int>::Path::~Path(Path *this)

{
  pointer ppPVar1;
  Path *this_00;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppPVar1 = (this->children).
                super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->children).
                            super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3);
      uVar2 = uVar2 + 1) {
    this_00 = ppPVar1[uVar2];
    if (this_00 != (Path *)0x0) {
      ~Path(this_00);
    }
    operator_delete(this_00,0x28);
  }
  std::_Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>::
  ~_Vector_base(&(this->children).
                 super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>
               );
  return;
}

Assistant:

~Path() {
            for(size_t i = 0; i < children.size(); i++) {
                delete children[i];
            }
        }